

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool print_value(cJSON *item,printbuffer *output_buffer)

{
  double dVar1;
  byte bVar2;
  uchar uVar3;
  size_t sVar4;
  cJSON_bool cVar5;
  cJSON_bool cVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  size_t sVar10;
  lconv *plVar11;
  ulong uVar12;
  uchar uVar13;
  cJSON *item_00;
  ulong uVar14;
  long in_FS_OFFSET;
  uchar number_buffer [26];
  double local_60;
  uchar local_58 [40];
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  cVar5 = 0;
  cVar6 = 0;
  if (output_buffer != (printbuffer *)0x0 && item != (cJSON *)0x0) {
    bVar2 = (byte)item->type;
    cVar6 = cVar5;
    if (bVar2 < 0x10) {
      switch(bVar2) {
      case 1:
        puVar9 = ensure(output_buffer,6);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"false",6);
LAB_00102eee:
          cVar6 = 1;
        }
        break;
      case 2:
        puVar9 = ensure(output_buffer,5);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"true",5);
          goto LAB_00102eee;
        }
        break;
      case 4:
        puVar9 = ensure(output_buffer,5);
        if (puVar9 != (uchar *)0x0) {
          builtin_memcpy(puVar9,"null",5);
          goto LAB_00102eee;
        }
        break;
      case 8:
        dVar1 = item->valuedouble;
        plVar11 = localeconv();
        uVar3 = *plVar11->decimal_point;
        if ((dVar1 * 0.0 != 0.0) || (NAN(dVar1 * 0.0))) {
          builtin_memcpy(local_58,"null",5);
          uVar7 = 4;
        }
        else {
          uVar7 = sprintf((char *)local_58,"%1.15g");
          iVar8 = __isoc99_sscanf(local_58,"%lg",&local_60);
          if (iVar8 == 1) {
            if ((local_60 == dVar1) && (!NAN(local_60) && !NAN(dVar1))) goto LAB_00102e8b;
          }
          uVar7 = sprintf((char *)local_58,"%1.17g");
        }
LAB_00102e8b:
        cVar6 = 0;
        if (uVar7 < 0x1a) {
          uVar14 = (ulong)uVar7;
          puVar9 = ensure(output_buffer,uVar14);
          if (puVar9 != (uchar *)0x0) {
            uVar12 = 0;
            if (uVar7 != 0) {
              do {
                uVar13 = local_58[uVar12];
                if (local_58[uVar12] == uVar3) {
                  uVar13 = '.';
                }
                puVar9[uVar12] = uVar13;
                uVar12 = uVar12 + 1;
              } while (uVar14 != uVar12);
            }
            puVar9[uVar12] = '\0';
            output_buffer->offset = output_buffer->offset + uVar14;
            goto LAB_00102eee;
          }
        }
      }
    }
    else if (bVar2 < 0x40) {
      if (bVar2 == 0x10) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          cVar6 = print_string_ptr((uchar *)item->valuestring,output_buffer);
          return cVar6;
        }
        goto LAB_00102f20;
      }
      if (bVar2 == 0x20) {
        item_00 = item->child;
        puVar9 = ensure(output_buffer,1);
        if (puVar9 != (uchar *)0x0) {
          *puVar9 = '[';
          output_buffer->offset = output_buffer->offset + 1;
          output_buffer->depth = output_buffer->depth + 1;
          for (; item_00 != (cJSON *)0x0; item_00 = item_00->next) {
            cVar5 = print_value(item_00,output_buffer);
            if (cVar5 == 0) goto switchD_00102bf8_caseD_3;
            if (output_buffer->buffer != (uchar *)0x0) {
              sVar4 = output_buffer->offset;
              sVar10 = strlen((char *)(output_buffer->buffer + sVar4));
              output_buffer->offset = sVar10 + sVar4;
            }
            if (item_00->next != (cJSON *)0x0) {
              uVar14 = (ulong)(output_buffer->format == 0);
              puVar9 = ensure(output_buffer,uVar14 ^ 3);
              if (puVar9 == (uchar *)0x0) goto switchD_00102bf8_caseD_3;
              *puVar9 = ',';
              if (output_buffer->format == 0) {
                puVar9 = puVar9 + 1;
              }
              else {
                puVar9[1] = ' ';
                puVar9 = puVar9 + 2;
              }
              *puVar9 = '\0';
              output_buffer->offset = output_buffer->offset + (2 - uVar14);
            }
          }
          puVar9 = ensure(output_buffer,2);
          if (puVar9 != (uchar *)0x0) {
            puVar9[0] = ']';
            puVar9[1] = '\0';
            output_buffer->depth = output_buffer->depth - 1;
            goto LAB_00102eee;
          }
        }
      }
    }
    else {
      if (bVar2 == 0x40) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          cVar6 = print_object(item,output_buffer);
          return cVar6;
        }
        goto LAB_00102f20;
      }
      if (bVar2 == 0x80) {
        if (item->valuestring == (char *)0x0) {
          if (output_buffer->noalloc == 0) {
            (*(output_buffer->hooks).deallocate)(output_buffer->buffer);
          }
        }
        else {
          sVar10 = strlen(item->valuestring);
          puVar9 = ensure(output_buffer,sVar10 + 1);
          if (puVar9 != (uchar *)0x0) {
            memcpy(puVar9,item->valuestring,sVar10 + 1);
            goto LAB_00102eee;
          }
        }
      }
    }
  }
switchD_00102bf8_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return cVar6;
  }
LAB_00102f20:
  __stack_chk_fail();
}

Assistant:

static cJSON_bool print_value(const cJSON * const item, printbuffer * const output_buffer)
{
    unsigned char *output = NULL;

    if ((item == NULL) || (output_buffer == NULL))
    {
        return false;
    }

    switch ((item->type) & 0xFF)
    {
        case cJSON_NULL:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "null");
            return true;

        case cJSON_False:
            output = ensure(output_buffer, 6);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "false");
            return true;

        case cJSON_True:
            output = ensure(output_buffer, 5);
            if (output == NULL)
            {
                return false;
            }
            strcpy((char*)output, "true");
            return true;

        case cJSON_Number:
            return print_number(item, output_buffer);

        case cJSON_Raw:
        {
            size_t raw_length = 0;
            if (item->valuestring == NULL)
            {
                if (!output_buffer->noalloc)
                {
                    output_buffer->hooks.deallocate(output_buffer->buffer);
                }
                return false;
            }

            raw_length = strlen(item->valuestring) + sizeof("");
            output = ensure(output_buffer, raw_length);
            if (output == NULL)
            {
                return false;
            }
            memcpy(output, item->valuestring, raw_length);
            return true;
        }

        case cJSON_String:
            return print_string(item, output_buffer);

        case cJSON_Array:
            return print_array(item, output_buffer);

        case cJSON_Object:
            return print_object(item, output_buffer);

        default:
            return false;
    }
}